

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.cpp
# Opt level: O2

void basisu::unpack_etc2_eac_r(void *p,color_rgba *pPixels,uint32_t c)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint64_t uVar4;
  byte bVar5;
  uint32_t y;
  long lVar6;
  int iVar7;
  uint8_t *puVar8;
  byte bVar9;
  uint32_t x;
  long lVar10;
  
  uVar4 = etc2_eac_r11::get_sels((etc2_eac_r11 *)p);
  uVar1 = *p;
  uVar2 = uVar1 >> 0xc & 0xf;
  iVar7 = 1;
  if (uVar2 != 0) {
    iVar7 = uVar2 * 8;
  }
  puVar8 = (pPixels->field_0).m_comps + c;
  bVar9 = 0x2d;
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    bVar5 = bVar9;
    for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
      iVar3 = (char)(&g_etc2_eac_tables)
                    [(ulong)((uint)(uVar4 >> (bVar5 & 0x3f)) & 7) + (ulong)(uVar1 >> 8 & 0xf) * 8] *
              iVar7 + (uVar1 & 0xff) * 8 + 4;
      if (0x7fe < iVar3) {
        iVar3 = 0x7ff;
      }
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      puVar8[lVar10 * 4] = (uint8_t)((ulong)(iVar3 * 0xff + 0x3ff) / 0x7ff);
      bVar5 = bVar5 - 0xc;
    }
    puVar8 = puVar8 + 0x10;
    bVar9 = bVar9 - 3;
  }
  return;
}

Assistant:

void unpack_etc2_eac_r(const void *p, color_rgba* pPixels, uint32_t c)
	{
		const etc2_eac_r11* pBlock = static_cast<const etc2_eac_r11*>(p);
		const uint64_t sels = pBlock->get_sels();

		const int base = (int)pBlock->m_base * 8 + 4;
		const int mul = pBlock->m_mul ? ((int)pBlock->m_mul * 8) : 1;
		const int table = (int)pBlock->m_table;

		for (uint32_t y = 0; y < 4; y++)
		{
			for (uint32_t x = 0; x < 4; x++)
			{
				const uint32_t shift = 45 - ((y + x * 4) * 3);
				
				const uint32_t sel = (uint32_t)((sels >> shift) & 7);
				
				int val = base + g_etc2_eac_tables[table][sel] * mul;
				val = clamp<int>(val, 0, 2047);

				// Convert to 8-bits with rounding
				//pPixels[x + y * 4].m_comps[c] = static_cast<uint8_t>((val * 255 + 1024) / 2047);
				pPixels[x + y * 4].m_comps[c] = static_cast<uint8_t>((val * 255 + 1023) / 2047);

			} // x
		} // y
	}